

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PClass::PClass(PClass *this)

{
  PClass *local_30 [3];
  FName local_14;
  PClass *local_10;
  PClass *this_local;
  
  local_10 = this;
  FName::FName(&local_14,NAME_None);
  PNativeStruct::PNativeStruct(&this->super_PNativeStruct,&local_14);
  (this->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  super_PTypeBase.super_DObject._vptr_DObject = &PTR_StaticType_009f3d70;
  TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_>::TArray
            (&this->SpecialInits);
  TArray<VMFunction_*,_VMFunction_*>::TArray(&this->Virtuals);
  *(undefined4 *)
   ((long)&(this->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
           super_PType.super_PTypeBase.super_DObject + 0x24) = 0x28;
  this->ParentClass = (PClass *)0x0;
  this->Pointers = (size_t *)0x0;
  this->FlatPointers = (size_t *)0x0;
  (this->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  HashNext = (PType *)0x0;
  this->Defaults = (BYTE *)0x0;
  this->bRuntimeClass = false;
  this->bExported = false;
  this->bDecorateClass = false;
  this->ConstructNative = (_func_void_void_ptr *)0x0;
  FString::operator=(&(this->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType
                      .super_PType.mDescriptiveName,"Class");
  local_30[0] = this;
  TArray<PClass_*,_PClass_*>::Push(&AllClasses,local_30);
  return;
}

Assistant:

PClass::PClass()
{
	Size = sizeof(DObject);
	ParentClass = nullptr;
	Pointers = nullptr;
	FlatPointers = nullptr;
	HashNext = nullptr;
	Defaults = nullptr;
	bRuntimeClass = false;
	bExported = false;
	bDecorateClass = false;
	ConstructNative = nullptr;
	mDescriptiveName = "Class";

	PClass::AllClasses.Push(this);
}